

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void AsyncTest(void)

{
  __single_object _Var1;
  uint32_t nInitWorkers;
  ostream *poVar2;
  CAsyncTask *task;
  int iVar3;
  bool bVar4;
  __single_object pTaskManager;
  
  std::make_unique<sftm::CAsyncTaskManager>();
  _Var1 = pTaskManager;
  nInitWorkers = std::thread::hardware_concurrency();
  sftm::CAsyncTaskManager::Start
            ((CAsyncTaskManager *)
             _Var1._M_t.
             super___uniq_ptr_impl<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_sftm::CAsyncTaskManager_*,_std::default_delete<sftm::CAsyncTaskManager>_>
             .super__Head_base<0UL,_sftm::CAsyncTaskManager_*,_false>._M_head_impl,nInitWorkers);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n\n\nAsync manager started on ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," threads\n");
  iVar3 = 100;
  std::chrono::_V2::system_clock::now();
  while (_Var1._M_t.
         super___uniq_ptr_impl<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_sftm::CAsyncTaskManager_*,_std::default_delete<sftm::CAsyncTaskManager>_>
         .super__Head_base<0UL,_sftm::CAsyncTaskManager_*,_false>._M_head_impl =
              pTaskManager._M_t.
              super___uniq_ptr_impl<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_sftm::CAsyncTaskManager_*,_std::default_delete<sftm::CAsyncTaskManager>_>
              .super__Head_base<0UL,_sftm::CAsyncTaskManager_*,_false>._M_head_impl,
        bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    task = (CAsyncTask *)operator_new(8);
    task->_vptr_CAsyncTask = (_func_int **)&PTR__CAsyncTask_00106d28;
    sftm::CAsyncTaskManager::PushTask
              ((CAsyncTaskManager *)
               _Var1._M_t.
               super___uniq_ptr_impl<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_sftm::CAsyncTaskManager_*,_std::default_delete<sftm::CAsyncTaskManager>_>
               .super__Head_base<0UL,_sftm::CAsyncTaskManager_*,_false>._M_head_impl,task);
  }
  do {
  } while (AsyncTest::nExecutedTasks.super___atomic_base<unsigned_int>._M_i != 100);
  std::chrono::_V2::system_clock::now();
  poVar2 = std::operator<<((ostream *)&std::cout,"\tPlanned tasks: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"; Execued tasks: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,";");
  poVar2 = std::operator<<((ostream *)&std::cout,"\n\tExecution time:\t\t");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<(poVar2,"\tuS");
  sftm::CAsyncTaskManager::Stop
            ((CAsyncTaskManager *)
             pTaskManager._M_t.
             super___uniq_ptr_impl<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_sftm::CAsyncTaskManager_*,_std::default_delete<sftm::CAsyncTaskManager>_>
             .super__Head_base<0UL,_sftm::CAsyncTaskManager_*,_false>._M_head_impl);
  std::operator<<((ostream *)&std::cout,"\n\tAsync manager stopped\n");
  std::unique_ptr<sftm::CAsyncTaskManager,_std::default_delete<sftm::CAsyncTaskManager>_>::
  ~unique_ptr(&pTaskManager);
  return;
}

Assistant:

void AsyncTest() noexcept
{
	constexpr std::uint32_t nTaskPlanCount = 100;

	static std::atomic<uint32_t> nExecutedTasks = { 0 };

	class CTestTask : public sftm::CAsyncTask
	{
	public:
		virtual ~CTestTask() {}

	public:
		void Execute() noexcept override
		{
			++nExecutedTasks;

			delete this;
		}
	};

	auto pTaskManager = std::make_unique<sftm::CAsyncTaskManager>();
	pTaskManager->Start(std::thread::hardware_concurrency());
	std::cout << "\n\n\nAsync manager started on " << pTaskManager->GetWorkersCount() << " threads\n";

	auto t1 = std::chrono::high_resolution_clock::now();

	for(std::uint32_t n = 0; n < nTaskPlanCount; ++n)
	{
		pTaskManager->PushTask(new CTestTask);
	}

	while(nExecutedTasks != nTaskPlanCount){}

	auto t2 = std::chrono::high_resolution_clock::now();
	auto nUsCount = std::chrono::duration_cast<std::chrono::microseconds>(t2 - t1).count();
	std::cout << "	Planned tasks: " << nTaskPlanCount << "; Execued tasks: " << nExecutedTasks << ";";
	std::cout << "\n	Execution time:		" << nUsCount << "	uS";

	pTaskManager->Stop();
	std::cout << "\n	Async manager stopped\n";
}